

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O1

void __thiscall SubprocessTestSetWithMulti::Run(SubprocessTestSetWithMulti *this)

{
  _Map_pointer pppSVar1;
  Test *pTVar2;
  SubprocessTestSetWithMulti *pSVar3;
  bool bVar4;
  int iVar5;
  ExitStatus EVar6;
  Subprocess *pSVar7;
  string *psVar8;
  int i;
  long lVar9;
  Subprocess *processes [3];
  char *kCommands [3];
  allocator<char> local_99;
  SubprocessTestSetWithMulti *local_98;
  SubprocessSet *local_90;
  Subprocess *local_88 [4];
  string local_68;
  char *local_48 [3];
  
  local_48[0] = "ls /";
  local_48[1] = "id -u";
  local_48[2] = "pwd";
  local_90 = &(this->super_SubprocessTest).subprocs_;
  lVar9 = 0;
  local_98 = this;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,local_48[lVar9],&local_99);
    pSVar7 = SubprocessSet::Add(local_90,&local_68,false);
    local_88[lVar9] = pSVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    bVar4 = testing::Test::Check
                      (g_current_test,pSVar7 != (Subprocess *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                       ,0xc2,"(Subprocess *) 0 != processes[i]");
    if (!bVar4) goto LAB_0017809b;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  bVar4 = testing::Test::Check
                    (g_current_test,
                     (long)(local_98->super_SubprocessTest).subprocs_.running_.
                           super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(local_98->super_SubprocessTest).subprocs_.running_.
                           super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                           super__Vector_impl_data._M_start == 0x18,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                     ,0xc5,"3u == subprocs_.running_.size()");
  if (bVar4) {
    lVar9 = 0;
    do {
      pTVar2 = g_current_test;
      pSVar7 = local_88[lVar9];
      bVar4 = Subprocess::Done(pSVar7);
      bVar4 = testing::Test::Check
                        (pTVar2,!bVar4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                         ,199,"processes[i]->Done()");
      pTVar2 = g_current_test;
      if (!bVar4) goto LAB_0017809b;
      psVar8 = Subprocess::GetOutput_abi_cxx11_(pSVar7);
      iVar5 = std::__cxx11::string::compare((char *)psVar8);
      bVar4 = testing::Test::Check
                        (pTVar2,iVar5 == 0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                         ,200,"\"\" == processes[i]->GetOutput()");
      pSVar3 = local_98;
      if (!bVar4) goto LAB_0017809b;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    local_88[3] = local_88[2];
    while (((bVar4 = Subprocess::Done(local_88[0]), !bVar4 ||
            (bVar4 = Subprocess::Done(local_88[1]), !bVar4)) ||
           (bVar4 = Subprocess::Done(local_88[3]), !bVar4))) {
      bVar4 = testing::Test::Check
                        (g_current_test,
                         (pSVar3->super_SubprocessTest).subprocs_.running_.
                         super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                         super__Vector_impl_data._M_finish !=
                         (pSVar3->super_SubprocessTest).subprocs_.running_.
                         super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                         ,0xcd,"subprocs_.running_.size() > 0u");
      if (!bVar4) goto LAB_0017809b;
      SubprocessSet::DoWork(local_90);
    }
    bVar4 = testing::Test::Check
                      (g_current_test,
                       (pSVar3->super_SubprocessTest).subprocs_.running_.
                       super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                       super__Vector_impl_data._M_finish ==
                       (pSVar3->super_SubprocessTest).subprocs_.running_.
                       super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                       ,0xd1,"0u == subprocs_.running_.size()");
    if ((bVar4) &&
       (pppSVar1 = *(_Map_pointer *)
                    ((long)&(pSVar3->super_SubprocessTest).subprocs_.finished_.c.
                            super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                            super__Deque_impl_data + 0x48),
       bVar4 = testing::Test::Check
                         (g_current_test,
                          ((long)*(_Elt_pointer *)
                                  ((long)&(pSVar3->super_SubprocessTest).subprocs_.finished_.c.
                                          super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>
                                          ._M_impl.super__Deque_impl_data + 0x20) -
                           (long)((iterator *)
                                 ((long)&(pSVar3->super_SubprocessTest).subprocs_.finished_.c.
                                         super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>
                                         ._M_impl.super__Deque_impl_data + 0x10))->_M_cur >> 3) +
                          ((long)((iterator *)
                                 ((long)&(pSVar3->super_SubprocessTest).subprocs_.finished_.c.
                                         super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>
                                         ._M_impl.super__Deque_impl_data + 0x30))->_M_cur -
                           (long)*(_Elt_pointer *)
                                  ((long)&(pSVar3->super_SubprocessTest).subprocs_.finished_.c.
                                          super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>
                                          ._M_impl.super__Deque_impl_data + 0x38) >> 3) +
                          ((((ulong)((long)pppSVar1 -
                                    (long)*(_Map_pointer *)
                                           ((long)&(pSVar3->super_SubprocessTest).subprocs_.
                                                   finished_.c.
                                                                                                      
                                                  super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>
                                                  ._M_impl.super__Deque_impl_data + 0x28)) >> 3) - 1
                           ) + (ulong)(pppSVar1 == (_Map_pointer)0x0)) * 0x40 == 3,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                          ,0xd2,"3u == subprocs_.finished_.size()"), bVar4)) {
      lVar9 = 0;
      goto LAB_00177ff3;
    }
  }
LAB_0017809b:
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  return;
LAB_00177ff3:
  pTVar2 = g_current_test;
  pSVar7 = local_88[lVar9];
  EVar6 = Subprocess::Finish(pSVar7);
  bVar4 = testing::Test::Check
                    (pTVar2,EVar6 == ExitSuccess,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                     ,0xd5,"ExitSuccess == processes[i]->Finish()");
  pTVar2 = g_current_test;
  if (!bVar4) goto LAB_0017809b;
  psVar8 = Subprocess::GetOutput_abi_cxx11_(pSVar7);
  iVar5 = std::__cxx11::string::compare((char *)psVar8);
  bVar4 = testing::Test::Check
                    (pTVar2,iVar5 != 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                     ,0xd6,"\"\" != processes[i]->GetOutput()");
  if (!bVar4) goto LAB_0017809b;
  Subprocess::~Subprocess(pSVar7);
  operator_delete(pSVar7,0x30);
  lVar9 = lVar9 + 1;
  if (lVar9 == 3) {
    return;
  }
  goto LAB_00177ff3;
}

Assistant:

TEST_F(SubprocessTest, SetWithMulti) {
  Subprocess* processes[3];
  const char* kCommands[3] = {
    kSimpleCommand,
#ifdef _WIN32
    "cmd /c echo hi",
    "cmd /c time /t",
#else
    "id -u",
    "pwd",
#endif
  };

  for (int i = 0; i < 3; ++i) {
    processes[i] = subprocs_.Add(kCommands[i]);
    ASSERT_NE((Subprocess *) 0, processes[i]);
  }

  ASSERT_EQ(3u, subprocs_.running_.size());
  for (int i = 0; i < 3; ++i) {
    ASSERT_FALSE(processes[i]->Done());
    ASSERT_EQ("", processes[i]->GetOutput());
  }

  while (!processes[0]->Done() || !processes[1]->Done() ||
         !processes[2]->Done()) {
    ASSERT_GT(subprocs_.running_.size(), 0u);
    subprocs_.DoWork();
  }

  ASSERT_EQ(0u, subprocs_.running_.size());
  ASSERT_EQ(3u, subprocs_.finished_.size());

  for (int i = 0; i < 3; ++i) {
    ASSERT_EQ(ExitSuccess, processes[i]->Finish());
    ASSERT_NE("", processes[i]->GetOutput());
    delete processes[i];
  }
}